

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O1

mat4_t * mat4_ortho(mat4_t *__return_storage_ptr__,float left,float right,float bottom,float top)

{
  __return_storage_ptr__->m[0][0] = 2.0 / (right - left);
  *(float *)((long)__return_storage_ptr__ + 4) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[0] + 3) = 0;
  __return_storage_ptr__->m[1][1] = 2.0 / (top - bottom);
  ((float *)((long)__return_storage_ptr__ + 0x10))[2] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x10))[3] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[1] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[2] = -1.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[3] = 0.0;
  __return_storage_ptr__->m[3][0] = -(left + right) / (right - left);
  __return_storage_ptr__->m[3][1] = -(bottom + top) / (top - bottom);
  ((float *)((long)__return_storage_ptr__ + 0x30))[2] = -0.0;
  ((float *)((long)__return_storage_ptr__ + 0x30))[3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho(float left, float right, float bottom, float top) {
    return mat4_ortho4(left, right, bottom, top, -1.0f, 1.0f);
}